

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_queries.cpp
# Opt level: O1

string * __thiscall
duckdb::PragmaImportDatabase_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,ClientContext *context,
          FunctionParameters *parameters)

{
  ParserOptions options_p;
  uint uVar1;
  int iVar2;
  FileSystem *this_00;
  const_reference pvVar3;
  undefined4 extraout_var;
  void *__s;
  type pFVar4;
  pointer this_01;
  CopyStatement *pCVar5;
  type pCVar6;
  long *plVar7;
  size_type *psVar8;
  pointer this_02;
  long lVar9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> handle;
  string query;
  Parser parser;
  string file_path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  files;
  string file_name;
  string *local_198;
  _Head_base<0UL,_duckdb::FileHandle_*,_false> local_190;
  string *local_188;
  string local_180;
  string local_160;
  ClientContext *local_140;
  undefined1 local_138 [32];
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  string local_f8;
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  local_d8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  string *local_98;
  unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *local_90;
  string local_88;
  string *local_68;
  string *local_60;
  string local_50;
  ulong __n;
  
  local_140 = context;
  this_00 = FileSystem::GetFileSystem((ClientContext *)this);
  local_a0 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_a0;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_138._0_8_ = local_138 + 0x10;
  local_188 = __return_storage_ptr__;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"schema.sql","");
  local_118[0] = local_108;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"load.sql","");
  __l._M_len = 2;
  __l._M_array = (iterator)local_138;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_68,__l,(allocator_type *)&local_88);
  lVar9 = 0;
  do {
    if (local_108 + lVar9 != *(undefined1 **)((long)local_118 + lVar9)) {
      operator_delete(*(undefined1 **)((long)local_118 + lVar9));
    }
    lVar9 = lVar9 + -0x20;
  } while (lVar9 != -0x40);
  local_198 = local_68;
  local_98 = local_60;
  if (local_68 != local_60) {
    do {
      pvVar3 = vector<duckdb::Value,_true>::operator[]((vector<duckdb::Value,_true> *)local_140,0);
      Value::ToString_abi_cxx11_((string *)local_138,pvVar3);
      FileSystem::JoinPath(&local_88,this_00,(string *)local_138,local_198);
      if ((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
          local_138._0_8_ !=
          (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
          (local_138 + 0x10)) {
        operator_delete((void *)local_138._0_8_);
      }
      (*this_00->_vptr_FileSystem[2])(&local_190,this_00,&local_88,1,0x100,0);
      unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::operator*
                ((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *)
                 &local_190);
      uVar1 = (*this_00->_vptr_FileSystem[8])(this_00);
      __n = CONCAT44(extraout_var,uVar1);
      __s = operator_new__(__n);
      switchD_0105b559::default(__s,0,__n);
      pFVar4 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
               operator*((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                          *)&local_190);
      (*this_00->_vptr_FileSystem[5])(this_00,pFVar4,__s,__n);
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_160,__s,(long)__s + (ulong)uVar1);
      iVar2 = ::std::__cxx11::string::compare((char *)local_198);
      if (iVar2 == 0) {
        local_a8 = 0;
        local_b8 = 1;
        uStack_b0 = 1000;
        options_p.max_expression_depth = 1000;
        options_p.preserve_identifier_case = true;
        options_p.integer_division = false;
        options_p._2_6_ = 0;
        options_p.extensions = (vector<duckdb::ParserExtension,_true> *)0x0;
        Parser::Parser((Parser *)local_138,options_p);
        Parser::ParseQuery((Parser *)local_138,&local_160);
        local_d8.
        super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_138._0_8_;
        local_d8.
        super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_138._8_8_;
        local_d8.
        super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_138._16_8_;
        local_138._0_8_ =
             (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
             0x0;
        local_138._8_8_ =
             (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
             0x0;
        local_138._16_8_ = 0;
        local_160._M_string_length = 0;
        *local_160._M_dataplus._M_p = '\0';
        local_90 = local_d8.
                   super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        this_02 = local_d8.
                  super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (local_d8.
            super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_d8.
            super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            this_01 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                      ::operator->(this_02);
            pCVar5 = SQLStatement::Cast<duckdb::CopyStatement>(this_01);
            pCVar6 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::
                     operator*(&pCVar5->info);
            FileSystem::ExtractName(&local_50,this_00,&pCVar6->file_path);
            pvVar3 = vector<duckdb::Value,_true>::operator[]
                               ((vector<duckdb::Value,_true> *)local_140,0);
            Value::ToString_abi_cxx11_(&local_f8,pvVar3);
            FileSystem::JoinPath(&local_180,this_00,&local_f8,&local_50);
            ::std::__cxx11::string::operator=((string *)&pCVar6->file_path,(string *)&local_180);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) {
              operator_delete(local_180._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p);
            }
            (*(pCVar5->super_SQLStatement)._vptr_SQLStatement[2])(&local_f8,pCVar5);
            plVar7 = (long *)::std::__cxx11::string::append((char *)&local_f8);
            local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
            psVar8 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar8) {
              local_180.field_2._M_allocated_capacity = *psVar8;
              local_180.field_2._8_8_ = plVar7[3];
            }
            else {
              local_180.field_2._M_allocated_capacity = *psVar8;
              local_180._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_180._M_string_length = plVar7[1];
            *plVar7 = (long)psVar8;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_180._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) {
              operator_delete(local_180._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
            this_02 = this_02 + 1;
          } while (this_02 != local_90);
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
        ::~vector(&local_d8);
        ::std::
        vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                   *)local_138);
      }
      ::std::__cxx11::string::_M_append((char *)local_188,(ulong)local_160._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p);
      }
      operator_delete__(__s);
      if (local_190._M_head_impl != (FileHandle *)0x0) {
        (*(local_190._M_head_impl)->_vptr_FileHandle[1])();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      local_198 = local_198 + 1;
    } while (local_198 != local_98);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_68);
  return local_188;
}

Assistant:

string PragmaImportDatabase(ClientContext &context, const FunctionParameters &parameters) {
	auto &fs = FileSystem::GetFileSystem(context);

	string final_query;
	// read the "schema.sql" and "load.sql" files
	vector<string> files = {"schema.sql", "load.sql"};
	for (auto &file : files) {
		auto file_path = fs.JoinPath(parameters.values[0].ToString(), file);
		auto handle = fs.OpenFile(file_path, FileFlags::FILE_FLAGS_READ);
		auto fsize = fs.GetFileSize(*handle);
		auto buffer = make_unsafe_uniq_array<char>(UnsafeNumericCast<size_t>(fsize));
		fs.Read(*handle, buffer.get(), fsize);
		auto query = string(buffer.get(), UnsafeNumericCast<uint32_t>(fsize));
		// Replace the placeholder with the path provided to IMPORT
		if (file == "load.sql") {
			Parser parser;
			parser.ParseQuery(query);
			auto copy_statements = std::move(parser.statements);
			query.clear();
			for (auto &statement_p : copy_statements) {
				D_ASSERT(statement_p->type == StatementType::COPY_STATEMENT);
				auto &statement = statement_p->Cast<CopyStatement>();
				auto &info = *statement.info;
				auto file_name = fs.ExtractName(info.file_path);
				info.file_path = fs.JoinPath(parameters.values[0].ToString(), file_name);
				query += statement.ToString() + ";";
			}
		}
		final_query += query;
	}
	return final_query;
}